

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

void __thiscall
imrt::Station::reduce_apertures
          (Station *this,
          list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  reference ppVar5;
  int *piVar6;
  double *pdVar7;
  long in_RDI;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_stack_00000008;
  double in_stack_00000010;
  int in_stack_00000018;
  int in_stack_0000001c;
  Station *in_stack_00000020;
  int j;
  int i_1;
  int n;
  pair<const_int,_int> i;
  iterator __end1;
  iterator __begin1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *__range1;
  int nprev;
  int prev;
  int min_diff;
  int to;
  int from;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int local_64;
  int local_54;
  int local_50;
  pair<const_int,_int> local_48;
  _Self local_40;
  _Self local_38;
  long local_30;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  sVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::size
                    ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     0x1361b4);
  if (sVar4 != 0) {
    local_1c = 10000;
    local_20 = 0;
    local_24 = 0;
    local_30 = in_RDI + 0x140;
    local_38._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                   (in_stack_ffffffffffffff88);
    local_40._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                   (in_stack_ffffffffffffff88);
    while (bVar1 = std::operator!=(&local_38,&local_40), bVar1) {
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator*
                         ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)0x136227);
      local_48 = *ppVar5;
      if (local_20 == 0) {
        local_64 = local_48.second;
      }
      else {
        piVar6 = std::min<int>(&local_48.second,&local_24);
        local_64 = *piVar6;
      }
      if ((local_48.first - local_20) * local_64 < local_1c) {
        local_1c = (local_48.first - local_20) * local_64;
        if ((local_24 < local_48.second) && (local_20 != 0)) {
          local_14 = local_20;
          local_18 = local_48.first;
        }
        else {
          local_18 = local_20;
          local_14 = local_48.first;
        }
      }
      local_20 = local_48.first;
      local_24 = local_48.second;
      std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    }
    for (local_50 = 0; iVar2 = Collimator::getXdim(*(Collimator **)(in_RDI + 0xb0)),
        local_50 < iVar2; local_50 = local_50 + 1) {
      local_54 = 0;
      while (iVar2 = local_54, iVar3 = Collimator::getYdim(*(Collimator **)(in_RDI + 0xb0)),
            iVar2 < iVar3) {
        pdVar7 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_50,local_54);
        if ((int)(*pdVar7 + 0.5) == local_14) {
          change_intensity(in_stack_00000020,in_stack_0000001c,in_stack_00000018,in_stack_00000010,
                           in_stack_00000008);
        }
        local_54 = local_54 + 1;
      }
    }
  }
  return;
}

Assistant:

void Station::reduce_apertures(list< pair< int, double > >& diff){
	  if(int2nb.size()==0) return;

      int from,to, min_diff=10000;
      int prev=0; int nprev=0;
      for(auto i:int2nb  ){
          int n= (prev!=0)? min(i.second,nprev) : i.second;
          if((i.first-prev)*n < min_diff){
            min_diff=(i.first-prev)*n;
            if(nprev<i.second && prev!=0) {from=prev; to=i.first;}
            else {to=prev; from=i.first;}
          }
          prev=i.first;
          nprev=i.second;
      }
    //  printIntensity();
      for(int i=0; i<collimator.getXdim(); i++)
        for(int j=0; j<collimator.getYdim(); j++)
          if(int(I(i,j)+0.5)==from)
            change_intensity(i, j, to, &diff);
  }